

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O0

void vkt::api::anon_unknown_1::renderReferenceTriangle(PixelBufferAccess *dst,Vec4 (*vertices) [3])

{
  float *pointer_;
  PrimitiveList local_3c8;
  DrawCommand local_3a8;
  undefined1 local_378 [8];
  VertexAttrib vertexAttribs [1];
  undefined1 local_348 [7];
  Renderer renderer;
  ViewportState local_31c;
  undefined1 local_304 [8];
  RenderState renderState;
  MultisamplePixelBufferAccess local_1f8;
  undefined1 local_1d0 [8];
  RenderTarget renderTarget;
  MultisamplePixelBufferAccess colorBuffer;
  Program program;
  undefined1 local_88 [8];
  RefFragmentShader fragShader;
  RefVertexShader vertShader;
  Vec4 (*vertices_local) [3];
  PixelBufferAccess *dst_local;
  
  RefVertexShader::RefVertexShader
            ((RefVertexShader *)
             &fragShader.super_FragmentShader.m_outputs.
              super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  RefFragmentShader::RefFragmentShader((RefFragmentShader *)local_88);
  rr::Program::Program
            ((Program *)&colorBuffer.m_access.super_ConstPixelBufferAccess.m_data,
             (VertexShader *)
             &fragShader.super_FragmentShader.m_outputs.
              super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(FragmentShader *)local_88,
             (GeometryShader *)0x0);
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess
            ((MultisamplePixelBufferAccess *)
             &renderTarget.m_stencilBuffer.m_access.super_ConstPixelBufferAccess.m_data,dst);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_1f8);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&renderState.restart.restartIndex);
  rr::RenderTarget::RenderTarget
            ((RenderTarget *)local_1d0,
             (MultisamplePixelBufferAccess *)
             &renderTarget.m_stencilBuffer.m_access.super_ConstPixelBufferAccess.m_data,&local_1f8,
             (MultisamplePixelBufferAccess *)&renderState.restart.restartIndex);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)local_348,
             (MultisamplePixelBufferAccess *)
             &renderTarget.m_stencilBuffer.m_access.super_ConstPixelBufferAccess.m_data);
  rr::ViewportState::ViewportState(&local_31c,(MultisampleConstPixelBufferAccess *)local_348);
  rr::RenderState::RenderState((RenderState *)local_304,&local_31c,VIEWPORTORIENTATION_UPPER_LEFT);
  rr::Renderer::Renderer((Renderer *)((long)&vertexAttribs[0].generic.v + 0xf));
  pointer_ = tcu::Vector<float,_4>::getPtr(*vertices);
  rr::VertexAttrib::VertexAttrib((VertexAttrib *)local_378,VERTEXATTRIBTYPE_FLOAT,4,0x10,0,pointer_)
  ;
  rr::PrimitiveList::PrimitiveList(&local_3c8,PRIMITIVETYPE_TRIANGLES,3,0);
  rr::DrawCommand::DrawCommand
            (&local_3a8,(RenderState *)local_304,(RenderTarget *)local_1d0,
             (Program *)&colorBuffer.m_access.super_ConstPixelBufferAccess.m_data,1,
             (VertexAttrib *)local_378,&local_3c8);
  rr::Renderer::draw((Renderer *)((long)&vertexAttribs[0].generic.v + 0xf),&local_3a8);
  rr::Renderer::~Renderer((Renderer *)((long)&vertexAttribs[0].generic.v + 0xf));
  RefFragmentShader::~RefFragmentShader((RefFragmentShader *)local_88);
  RefVertexShader::~RefVertexShader
            ((RefVertexShader *)
             &fragShader.super_FragmentShader.m_outputs.
              super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void renderReferenceTriangle (const tcu::PixelBufferAccess& dst, const tcu::Vec4 (&vertices)[3])
{
	const RefVertexShader					vertShader;
	const RefFragmentShader					fragShader;
	const rr::Program						program			(&vertShader, &fragShader);
	const rr::MultisamplePixelBufferAccess	colorBuffer		= rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(dst);
	const rr::RenderTarget					renderTarget	(colorBuffer);
	const rr::RenderState					renderState		((rr::ViewportState(colorBuffer)), rr::VIEWPORTORIENTATION_UPPER_LEFT);
	const rr::Renderer						renderer;
	const rr::VertexAttrib					vertexAttribs[]	=
	{
		rr::VertexAttrib(rr::VERTEXATTRIBTYPE_FLOAT, 4, sizeof(tcu::Vec4), 0, vertices[0].getPtr())
	};

	renderer.draw(rr::DrawCommand(renderState,
								  renderTarget,
								  program,
								  DE_LENGTH_OF_ARRAY(vertexAttribs),
								  &vertexAttribs[0],
								  rr::PrimitiveList(rr::PRIMITIVETYPE_TRIANGLES, DE_LENGTH_OF_ARRAY(vertices), 0)));
}